

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string_n.hpp
# Opt level: O1

void __thiscall dna_string_n::build_rank_support(dna_string_n *this)

{
  int *piVar1;
  uint8_t *puVar2;
  pointer ppVar3;
  ulong uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined3 uVar9;
  undefined5 uVar10;
  undefined7 uVar11;
  unkbyte9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [11];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar22;
  ulong uVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  ulong uVar26;
  ulong uVar27;
  uint64_t uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  uint64_t uVar41;
  uint64_t uVar42;
  ushort uVar43;
  undefined1 auVar49 [16];
  char cVar51;
  byte bVar65;
  long lVar52;
  byte bVar59;
  char cVar60;
  byte bVar61;
  char cVar62;
  byte bVar63;
  char cVar64;
  char cVar66;
  byte bVar67;
  undefined1 auVar53 [12];
  undefined1 auVar57 [16];
  int iVar68;
  uint uVar69;
  undefined1 auVar70 [12];
  uint uVar78;
  uint uVar79;
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar80;
  int iVar81;
  undefined1 auVar82 [12];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar83 [12];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [12];
  undefined1 auVar101 [16];
  undefined1 auVar97 [12];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined4 uVar44;
  undefined6 uVar45;
  undefined8 uVar46;
  undefined1 auVar47 [12];
  undefined1 auVar48 [14];
  undefined1 auVar50 [16];
  undefined1 auVar54 [12];
  undefined1 auVar55 [14];
  undefined1 auVar56 [14];
  undefined1 auVar58 [16];
  undefined1 auVar71 [12];
  undefined1 auVar72 [14];
  undefined1 auVar77 [16];
  undefined1 auVar74 [16];
  undefined1 auVar84 [12];
  undefined1 auVar85 [14];
  undefined1 auVar86 [14];
  undefined1 auVar95 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar98 [14];
  undefined1 auVar99 [14];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  
  auVar21 = _DAT_0011d070;
  auVar20 = _DAT_0011d060;
  auVar19 = _DAT_0011d050;
  if (this->n_blocks == 1) {
    uVar29 = 0;
    uVar41 = 0;
    uVar42 = 0;
    iVar37 = 0;
    iVar38 = 0;
    iVar39 = 0;
    iVar40 = 0;
    uVar24 = 0;
    uVar25 = 0;
    uVar28 = 0;
    uVar32 = 0;
  }
  else {
    puVar2 = this->data;
    ppVar3 = (this->superblock_ranks).super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar37 = 0;
    iVar38 = 0;
    iVar39 = 0;
    iVar40 = 0;
    uVar23 = 0;
    uVar28 = 0;
    uVar25 = 0;
    uVar24 = 0;
    uVar29 = 0;
    uVar41 = 0;
    uVar42 = 0;
    do {
      uVar32 = uVar23 >> 0x19;
      if ((uVar23 & 0x1ffffff) == 0) {
        ppVar3[uVar32].A = uVar41;
        ppVar3[uVar32].C = uVar42;
        ppVar3[uVar32].G = uVar28;
        ppVar3[uVar32].N = uVar25;
        ppVar3[uVar32].T = uVar24;
        iVar37 = 0;
        iVar38 = 0;
        iVar39 = 0;
        iVar40 = 0;
        uVar29 = 0;
      }
      uVar26 = (ulong)(uint)((int)(uVar23 & 0x1ffffff) << 6);
      piVar1 = (int *)(puVar2 + uVar26 + 0x30 + uVar32 * 0x80000000);
      *piVar1 = iVar37;
      piVar1[1] = iVar38;
      piVar1[2] = iVar39;
      piVar1[3] = iVar40;
      uVar30 = (uVar29 & 0x7ff) + *(long *)(puVar2 + uVar26 + uVar32 * 0x80000000);
      *(ulong *)(puVar2 + uVar26 + uVar32 * 0x80000000) = uVar30;
      uVar22 = (ulong)((uint)(uVar29 >> 0xb) & 0x7ff) +
               *(long *)(puVar2 + uVar26 + 0x10 + uVar32 * 0x80000000);
      *(ulong *)(puVar2 + uVar26 + 0x10 + uVar32 * 0x80000000) = uVar22;
      uVar36 = (uVar29 >> 0x16 & 0x7ff) + *(long *)(puVar2 + uVar26 + 0x20 + uVar32 * 0x80000000);
      *(ulong *)(puVar2 + uVar26 + 0x20 + uVar32 * 0x80000000) = uVar36;
      uVar4 = *(ulong *)(puVar2 + uVar26 + 8 + uVar32 * 0x80000000);
      uVar33 = ~*(ulong *)(puVar2 + uVar26 + 0x18 + uVar32 * 0x80000000);
      uVar34 = uVar30 & uVar36 & ~uVar22 & 0xfffffffffffff800;
      uVar31 = ~*(ulong *)(puVar2 + uVar26 + 0x28 + uVar32 * 0x80000000);
      uVar35 = uVar4 & *(ulong *)(puVar2 + uVar26 + 0x28 + uVar32 * 0x80000000) & uVar33;
      uVar33 = uVar33 & uVar31;
      uVar31 = uVar31 & *(ulong *)(puVar2 + uVar26 + 0x18 + uVar32 * 0x80000000);
      uVar27 = ~uVar22 & 0xfffffffffffff800 & ~uVar36 & 0xfffffffffffff800;
      uVar22 = ~uVar36 & 0xfffffffffffff800 & uVar22;
      uVar36 = uVar27 & ~uVar30;
      uVar26 = ~uVar30 & uVar22;
      uVar22 = uVar22 & uVar30;
      uVar27 = uVar27 & uVar30;
      uVar30 = uVar33 & ~uVar4;
      uVar32 = ~uVar4 & uVar31;
      uVar31 = uVar31 & uVar4;
      uVar33 = uVar33 & uVar4;
      auVar87._0_2_ = (ushort)uVar35 >> 1;
      auVar87._2_2_ = (ushort)(uVar35 >> 0x10) >> 1;
      auVar87._4_2_ = (ushort)(uVar35 >> 0x20) >> 1;
      auVar87._6_2_ = (ushort)(uVar35 >> 0x31);
      auVar87._8_2_ = (ushort)uVar34 >> 1;
      auVar87._10_2_ = (ushort)(uVar34 >> 0x10) >> 1;
      auVar87._12_2_ = (ushort)(uVar34 >> 0x20) >> 1;
      auVar87._14_2_ = (ushort)(uVar34 >> 0x31);
      auVar87 = auVar87 & auVar19;
      uVar43 = CONCAT11((char)(uVar35 >> 8) - auVar87[1],(char)uVar35 - auVar87[0]);
      uVar44 = CONCAT13((char)(uVar35 >> 0x18) - auVar87[3],
                        CONCAT12((char)(uVar35 >> 0x10) - auVar87[2],uVar43));
      uVar45 = CONCAT15((char)(uVar35 >> 0x28) - auVar87[5],
                        CONCAT14((char)(uVar35 >> 0x20) - auVar87[4],uVar44));
      uVar46 = CONCAT17((char)(uVar35 >> 0x38) - auVar87[7],
                        CONCAT16((char)(uVar35 >> 0x30) - auVar87[6],uVar45));
      auVar53._0_10_ = CONCAT19((char)(uVar34 >> 8) - auVar87[9],CONCAT18(-auVar87[8],uVar46));
      auVar53[10] = (char)(uVar34 >> 0x10) - auVar87[10];
      auVar53[0xb] = (char)(uVar34 >> 0x18) - auVar87[0xb];
      auVar55[0xc] = (char)(uVar34 >> 0x20) - auVar87[0xc];
      auVar55._0_12_ = auVar53;
      auVar55[0xd] = (char)(uVar34 >> 0x28) - auVar87[0xd];
      auVar105[0xe] = (char)(uVar34 >> 0x30) - auVar87[0xe];
      auVar105._0_14_ = auVar55;
      auVar105[0xf] = (char)(uVar34 >> 0x38) - auVar87[0xf];
      auVar88 = auVar105 & auVar20;
      auVar57._0_2_ = uVar43 >> 2;
      auVar57._2_2_ = (ushort)((uint)uVar44 >> 0x12);
      auVar57._4_2_ = (ushort)((uint6)uVar45 >> 0x22);
      auVar57._6_2_ = (ushort)((ulong)uVar46 >> 0x32);
      auVar57._8_2_ = (ushort)((unkuint10)auVar53._0_10_ >> 0x42);
      auVar57._10_2_ = auVar53._10_2_ >> 2;
      auVar57._12_2_ = auVar55._12_2_ >> 2;
      auVar57._14_2_ = auVar105._14_2_ >> 2;
      auVar57 = auVar57 & auVar20;
      cVar51 = auVar57[0] + auVar88[0];
      bVar59 = auVar57[1] + auVar88[1];
      uVar43 = CONCAT11(bVar59,cVar51);
      cVar60 = auVar57[2] + auVar88[2];
      bVar61 = auVar57[3] + auVar88[3];
      uVar44 = CONCAT13(bVar61,CONCAT12(cVar60,uVar43));
      cVar62 = auVar57[4] + auVar88[4];
      bVar63 = auVar57[5] + auVar88[5];
      uVar45 = CONCAT15(bVar63,CONCAT14(cVar62,uVar44));
      cVar64 = auVar57[6] + auVar88[6];
      bVar65 = auVar57[7] + auVar88[7];
      uVar46 = CONCAT17(bVar65,CONCAT16(cVar64,uVar45));
      cVar66 = auVar57[8] + auVar88[8];
      bVar67 = auVar57[9] + auVar88[9];
      auVar54._0_10_ = CONCAT19(bVar67,CONCAT18(cVar66,uVar46));
      auVar54[10] = auVar57[10] + auVar88[10];
      auVar54[0xb] = auVar57[0xb] + auVar88[0xb];
      auVar56[0xc] = auVar57[0xc] + auVar88[0xc];
      auVar56._0_12_ = auVar54;
      auVar56[0xd] = auVar57[0xd] + auVar88[0xd];
      auVar58[0xe] = auVar57[0xe] + auVar88[0xe];
      auVar58._0_14_ = auVar56;
      auVar58[0xf] = auVar57[0xf] + auVar88[0xf];
      auVar89[0] = (char)(uVar43 >> 4) + cVar51;
      auVar89[1] = (bVar59 >> 4) + bVar59;
      auVar89[2] = (char)(ushort)((uint)uVar44 >> 0x14) + cVar60;
      auVar89[3] = (bVar61 >> 4) + bVar61;
      auVar89[4] = (char)(ushort)((uint6)uVar45 >> 0x24) + cVar62;
      auVar89[5] = (bVar63 >> 4) + bVar63;
      auVar89[6] = (char)(ushort)((ulong)uVar46 >> 0x34) + cVar64;
      auVar89[7] = (bVar65 >> 4) + bVar65;
      auVar89[8] = (char)(ushort)((unkuint10)auVar54._0_10_ >> 0x44) + cVar66;
      auVar89[9] = (bVar67 >> 4) + bVar67;
      auVar89[10] = (char)(auVar54._10_2_ >> 4) + auVar54[10];
      auVar89[0xb] = (auVar54[0xb] >> 4) + auVar54[0xb];
      auVar89[0xc] = (char)(auVar56._12_2_ >> 4) + auVar56[0xc];
      auVar89[0xd] = (auVar56[0xd] >> 4) + auVar56[0xd];
      auVar89[0xe] = (char)(auVar58._14_2_ >> 4) + auVar58[0xe];
      auVar89[0xf] = (auVar58[0xf] >> 4) + auVar58[0xf];
      auVar88 = psadbw(auVar89 & auVar21,(undefined1  [16])0x0);
      lVar52 = auVar88._8_8_ + auVar88._0_8_;
      auVar106._0_2_ = (ushort)uVar32 >> 1;
      auVar106._2_2_ = (ushort)(uVar32 >> 0x10) >> 1;
      auVar106._4_2_ = (ushort)(uVar32 >> 0x20) >> 1;
      auVar106._6_2_ = (ushort)(uVar32 >> 0x31);
      auVar106._8_2_ = (ushort)uVar31 >> 1;
      auVar106._10_2_ = (ushort)(uVar31 >> 0x10) >> 1;
      auVar106._12_2_ = (ushort)(uVar31 >> 0x20) >> 1;
      auVar106._14_2_ = (ushort)(uVar31 >> 0x31);
      auVar106 = auVar106 & auVar19;
      uVar43 = CONCAT11((char)(uVar32 >> 8) - auVar106[1],(char)uVar32 - auVar106[0]);
      uVar44 = CONCAT13((char)(uVar32 >> 0x18) - auVar106[3],
                        CONCAT12((char)(uVar32 >> 0x10) - auVar106[2],uVar43));
      uVar45 = CONCAT15((char)(uVar32 >> 0x28) - auVar106[5],
                        CONCAT14((char)(uVar32 >> 0x20) - auVar106[4],uVar44));
      uVar46 = CONCAT17((char)(uVar32 >> 0x38) - auVar106[7],
                        CONCAT16((char)(uVar32 >> 0x30) - auVar106[6],uVar45));
      auVar82._0_10_ =
           CONCAT19((char)(uVar31 >> 8) - auVar106[9],CONCAT18((char)uVar31 - auVar106[8],uVar46));
      auVar82[10] = (char)(uVar31 >> 0x10) - auVar106[10];
      auVar82[0xb] = (char)(uVar31 >> 0x18) - auVar106[0xb];
      auVar85[0xc] = (char)(uVar31 >> 0x20) - auVar106[0xc];
      auVar85._0_12_ = auVar82;
      auVar85[0xd] = (char)(uVar31 >> 0x28) - auVar106[0xd];
      auVar90[0xe] = (char)(uVar31 >> 0x30) - auVar106[0xe];
      auVar90._0_14_ = auVar85;
      auVar90[0xf] = (char)(uVar31 >> 0x38) - auVar106[0xf];
      auVar88 = auVar90 & auVar20;
      auVar91._0_2_ = uVar43 >> 2;
      auVar91._2_2_ = (ushort)((uint)uVar44 >> 0x12);
      auVar91._4_2_ = (ushort)((uint6)uVar45 >> 0x22);
      auVar91._6_2_ = (ushort)((ulong)uVar46 >> 0x32);
      auVar91._8_2_ = (ushort)((unkuint10)auVar82._0_10_ >> 0x42);
      auVar91._10_2_ = auVar82._10_2_ >> 2;
      auVar91._12_2_ = auVar85._12_2_ >> 2;
      auVar91._14_2_ = auVar90._14_2_ >> 2;
      auVar91 = auVar91 & auVar20;
      cVar51 = auVar91[0] + auVar88[0];
      bVar59 = auVar91[1] + auVar88[1];
      uVar43 = CONCAT11(bVar59,cVar51);
      cVar60 = auVar91[2] + auVar88[2];
      bVar61 = auVar91[3] + auVar88[3];
      uVar44 = CONCAT13(bVar61,CONCAT12(cVar60,uVar43));
      cVar62 = auVar91[4] + auVar88[4];
      bVar63 = auVar91[5] + auVar88[5];
      uVar45 = CONCAT15(bVar63,CONCAT14(cVar62,uVar44));
      cVar64 = auVar91[6] + auVar88[6];
      bVar65 = auVar91[7] + auVar88[7];
      uVar46 = CONCAT17(bVar65,CONCAT16(cVar64,uVar45));
      cVar66 = auVar91[8] + auVar88[8];
      bVar67 = auVar91[9] + auVar88[9];
      auVar83._0_10_ = CONCAT19(bVar67,CONCAT18(cVar66,uVar46));
      auVar83[10] = auVar91[10] + auVar88[10];
      auVar83[0xb] = auVar91[0xb] + auVar88[0xb];
      auVar86[0xc] = auVar91[0xc] + auVar88[0xc];
      auVar86._0_12_ = auVar83;
      auVar86[0xd] = auVar91[0xd] + auVar88[0xd];
      auVar92[0xe] = auVar91[0xe] + auVar88[0xe];
      auVar92._0_14_ = auVar86;
      auVar92[0xf] = auVar91[0xf] + auVar88[0xf];
      auVar107[0] = (char)(uVar43 >> 4) + cVar51;
      auVar107[1] = (bVar59 >> 4) + bVar59;
      auVar107[2] = (char)(ushort)((uint)uVar44 >> 0x14) + cVar60;
      auVar107[3] = (bVar61 >> 4) + bVar61;
      auVar107[4] = (char)(ushort)((uint6)uVar45 >> 0x24) + cVar62;
      auVar107[5] = (bVar63 >> 4) + bVar63;
      auVar107[6] = (char)(ushort)((ulong)uVar46 >> 0x34) + cVar64;
      auVar107[7] = (bVar65 >> 4) + bVar65;
      auVar107[8] = (char)(ushort)((unkuint10)auVar83._0_10_ >> 0x44) + cVar66;
      auVar107[9] = (bVar67 >> 4) + bVar67;
      auVar107[10] = (char)(auVar83._10_2_ >> 4) + auVar83[10];
      auVar107[0xb] = (auVar83[0xb] >> 4) + auVar83[0xb];
      auVar107[0xc] = (char)(auVar86._12_2_ >> 4) + auVar86[0xc];
      auVar107[0xd] = (auVar86[0xd] >> 4) + auVar86[0xd];
      auVar107[0xe] = (char)(auVar92._14_2_ >> 4) + auVar92[0xe];
      auVar107[0xf] = (auVar92[0xf] >> 4) + auVar92[0xf];
      auVar93._0_2_ = (ushort)uVar30 >> 1;
      auVar93._2_2_ = (ushort)(uVar30 >> 0x10) >> 1;
      auVar93._4_2_ = (ushort)(uVar30 >> 0x20) >> 1;
      auVar93._6_2_ = (ushort)(uVar30 >> 0x31);
      auVar93._8_2_ = (ushort)uVar33 >> 1;
      auVar93._10_2_ = (ushort)(uVar33 >> 0x10) >> 1;
      auVar93._12_2_ = (ushort)(uVar33 >> 0x20) >> 1;
      auVar93._14_2_ = (ushort)(uVar33 >> 0x31);
      auVar93 = auVar93 & auVar19;
      uVar43 = CONCAT11((char)(uVar30 >> 8) - auVar93[1],(char)uVar30 - auVar93[0]);
      uVar44 = CONCAT13((char)(uVar30 >> 0x18) - auVar93[3],
                        CONCAT12((char)(uVar30 >> 0x10) - auVar93[2],uVar43));
      uVar45 = CONCAT15((char)(uVar30 >> 0x28) - auVar93[5],
                        CONCAT14((char)(uVar30 >> 0x20) - auVar93[4],uVar44));
      uVar46 = CONCAT17((char)(uVar30 >> 0x38) - auVar93[7],
                        CONCAT16((char)(uVar30 >> 0x30) - auVar93[6],uVar45));
      auVar96._0_10_ =
           CONCAT19((char)(uVar33 >> 8) - auVar93[9],CONCAT18((char)uVar33 - auVar93[8],uVar46));
      auVar96[10] = (char)(uVar33 >> 0x10) - auVar93[10];
      auVar96[0xb] = (char)(uVar33 >> 0x18) - auVar93[0xb];
      auVar98[0xc] = (char)(uVar33 >> 0x20) - auVar93[0xc];
      auVar98._0_12_ = auVar96;
      auVar98[0xd] = (char)(uVar33 >> 0x28) - auVar93[0xd];
      auVar100[0xe] = (char)(uVar33 >> 0x30) - auVar93[0xe];
      auVar100._0_14_ = auVar98;
      auVar100[0xf] = (char)(uVar33 >> 0x38) - auVar93[0xf];
      auVar88 = auVar100 & auVar20;
      auVar101._0_2_ = uVar43 >> 2;
      auVar101._2_2_ = (ushort)((uint)uVar44 >> 0x12);
      auVar101._4_2_ = (ushort)((uint6)uVar45 >> 0x22);
      auVar101._6_2_ = (ushort)((ulong)uVar46 >> 0x32);
      auVar101._8_2_ = (ushort)((unkuint10)auVar96._0_10_ >> 0x42);
      auVar101._10_2_ = auVar96._10_2_ >> 2;
      auVar101._12_2_ = auVar98._12_2_ >> 2;
      auVar101._14_2_ = auVar100._14_2_ >> 2;
      auVar101 = auVar101 & auVar20;
      cVar51 = auVar101[0] + auVar88[0];
      bVar59 = auVar101[1] + auVar88[1];
      uVar43 = CONCAT11(bVar59,cVar51);
      cVar60 = auVar101[2] + auVar88[2];
      bVar61 = auVar101[3] + auVar88[3];
      uVar44 = CONCAT13(bVar61,CONCAT12(cVar60,uVar43));
      cVar62 = auVar101[4] + auVar88[4];
      bVar63 = auVar101[5] + auVar88[5];
      uVar45 = CONCAT15(bVar63,CONCAT14(cVar62,uVar44));
      cVar64 = auVar101[6] + auVar88[6];
      bVar65 = auVar101[7] + auVar88[7];
      uVar46 = CONCAT17(bVar65,CONCAT16(cVar64,uVar45));
      cVar66 = auVar101[8] + auVar88[8];
      bVar67 = auVar101[9] + auVar88[9];
      auVar97._0_10_ = CONCAT19(bVar67,CONCAT18(cVar66,uVar46));
      auVar97[10] = auVar101[10] + auVar88[10];
      auVar97[0xb] = auVar101[0xb] + auVar88[0xb];
      auVar99[0xc] = auVar101[0xc] + auVar88[0xc];
      auVar99._0_12_ = auVar97;
      auVar99[0xd] = auVar101[0xd] + auVar88[0xd];
      auVar102[0xe] = auVar101[0xe] + auVar88[0xe];
      auVar102._0_14_ = auVar99;
      auVar102[0xf] = auVar101[0xf] + auVar88[0xf];
      auVar94[0] = (char)(uVar43 >> 4) + cVar51;
      auVar94[1] = (bVar59 >> 4) + bVar59;
      auVar94[2] = (char)(ushort)((uint)uVar44 >> 0x14) + cVar60;
      auVar94[3] = (bVar61 >> 4) + bVar61;
      auVar94[4] = (char)(ushort)((uint6)uVar45 >> 0x24) + cVar62;
      auVar94[5] = (bVar63 >> 4) + bVar63;
      auVar94[6] = (char)(ushort)((ulong)uVar46 >> 0x34) + cVar64;
      auVar94[7] = (bVar65 >> 4) + bVar65;
      auVar94[8] = (char)(ushort)((unkuint10)auVar97._0_10_ >> 0x44) + cVar66;
      auVar94[9] = (bVar67 >> 4) + bVar67;
      auVar94[10] = (char)(auVar97._10_2_ >> 4) + auVar97[10];
      auVar94[0xb] = (auVar97[0xb] >> 4) + auVar97[0xb];
      auVar94[0xc] = (char)(auVar99._12_2_ >> 4) + auVar99[0xc];
      auVar94[0xd] = (auVar99[0xd] >> 4) + auVar99[0xd];
      auVar94[0xe] = (char)(auVar102._14_2_ >> 4) + auVar102[0xe];
      auVar94[0xf] = (auVar102[0xf] >> 4) + auVar102[0xf];
      auVar108 = psadbw(auVar107 & auVar21,(undefined1  [16])0x0);
      auVar88 = psadbw(auVar94 & auVar21,(undefined1  [16])0x0);
      sVar5 = auVar88._0_2_;
      sVar6 = auVar88._2_2_;
      sVar7 = auVar88._4_2_;
      sVar8 = auVar88._6_2_;
      iVar81 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar88[6] - (0xff < sVar8),
                        CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar88[4] - (0xff < sVar7),
                                 CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar88[2] -
                                          (0xff < sVar6),
                                          (0 < sVar5) * (sVar5 < 0x100) * auVar88[0] -
                                          (0xff < sVar5))));
      sVar5 = auVar88._8_2_;
      sVar6 = auVar88._10_2_;
      sVar7 = auVar88._12_2_;
      sVar8 = auVar88._14_2_;
      auVar84._0_8_ =
           CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar88[0xe] - (0xff < sVar8),
                    CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar88[0xc] - (0xff < sVar7),
                             CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar88[10] - (0xff < sVar6),
                                      CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar88[8] -
                                               (0xff < sVar5),iVar81))));
      sVar5 = auVar108._0_2_;
      auVar84[8] = (0 < sVar5) * (sVar5 < 0x100) * auVar108[0] - (0xff < sVar5);
      sVar5 = auVar108._2_2_;
      auVar84[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar108[2] - (0xff < sVar5);
      sVar5 = auVar108._4_2_;
      auVar84[10] = (0 < sVar5) * (sVar5 < 0x100) * auVar108[4] - (0xff < sVar5);
      sVar5 = auVar108._6_2_;
      auVar84[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar108[6] - (0xff < sVar5);
      sVar5 = auVar108._8_2_;
      auVar95[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar108[8] - (0xff < sVar5);
      auVar95._0_12_ = auVar84;
      sVar5 = auVar108._10_2_;
      auVar95[0xd] = (0 < sVar5) * (sVar5 < 0x100) * auVar108[10] - (0xff < sVar5);
      sVar5 = auVar108._12_2_;
      auVar95[0xe] = (0 < sVar5) * (sVar5 < 0x100) * auVar108[0xc] - (0xff < sVar5);
      sVar5 = auVar108._14_2_;
      auVar95[0xf] = (0 < sVar5) * (sVar5 < 0x100) * auVar108[0xe] - (0xff < sVar5);
      auVar103._0_2_ = (ushort)uVar26 >> 1;
      auVar103._2_2_ = (ushort)(uVar26 >> 0x10) >> 1;
      auVar103._4_2_ = (ushort)(uVar26 >> 0x20) >> 1;
      auVar103._6_2_ = (ushort)(uVar26 >> 0x31);
      auVar103._8_2_ = (ushort)uVar22 >> 1;
      auVar103._10_2_ = (ushort)(uVar22 >> 0x10) >> 1;
      auVar103._12_2_ = (ushort)(uVar22 >> 0x20) >> 1;
      auVar103._14_2_ = (ushort)(uVar22 >> 0x31);
      auVar103 = auVar103 & auVar19;
      bVar59 = (char)(uVar26 >> 8) - auVar103[1];
      uVar9 = CONCAT12((char)(uVar26 >> 0x18) - auVar103[3],
                       CONCAT11((char)(uVar26 >> 0x10) - auVar103[2],bVar59));
      uVar10 = CONCAT14((char)(uVar26 >> 0x28) - auVar103[5],
                        CONCAT13((char)(uVar26 >> 0x20) - auVar103[4],uVar9));
      uVar11 = CONCAT16((char)(uVar26 >> 0x38) - auVar103[7],
                        CONCAT15((char)(uVar26 >> 0x30) - auVar103[6],uVar10));
      Var12 = CONCAT18((char)(uVar22 >> 8) - auVar103[9],CONCAT17(-auVar103[8],uVar11));
      auVar13[9] = (char)(uVar22 >> 0x10) - auVar103[10];
      auVar13._0_9_ = Var12;
      auVar13[10] = (char)(uVar22 >> 0x18) - auVar103[0xb];
      auVar15[0xb] = (char)(uVar22 >> 0x20) - auVar103[0xc];
      auVar15._0_11_ = auVar13;
      auVar15[0xc] = (char)(uVar22 >> 0x28) - auVar103[0xd];
      auVar17[0xd] = (char)(uVar22 >> 0x30) - auVar103[0xe];
      auVar17._0_13_ = auVar15;
      auVar17[0xe] = (char)(uVar22 >> 0x38) - auVar103[0xf];
      auVar88[0xf] = 0;
      auVar88._0_15_ = auVar17;
      auVar88 = auVar88 << 8 & auVar20;
      auVar73._0_2_ = (ushort)((ushort)bVar59 << 8) >> 2;
      auVar73._2_2_ = (ushort)((uint3)uVar9 >> 10);
      auVar73._4_2_ = (ushort)((uint5)uVar10 >> 0x1a);
      auVar73._6_2_ = (ushort)((uint7)uVar11 >> 0x2a);
      auVar73._8_2_ = (ushort)((unkuint9)Var12 >> 0x3a);
      auVar73._10_2_ = auVar13._9_2_ >> 2;
      auVar73._12_2_ = auVar15._11_2_ >> 2;
      auVar73._14_2_ = auVar17._13_2_ >> 2;
      auVar73 = auVar73 & auVar20;
      bVar59 = auVar73[1] + auVar88[1];
      uVar43 = CONCAT11(bVar59,auVar73[0]);
      cVar51 = auVar73[2] + auVar88[2];
      bVar61 = auVar73[3] + auVar88[3];
      uVar44 = CONCAT13(bVar61,CONCAT12(cVar51,uVar43));
      cVar60 = auVar73[4] + auVar88[4];
      bVar63 = auVar73[5] + auVar88[5];
      uVar45 = CONCAT15(bVar63,CONCAT14(cVar60,uVar44));
      cVar62 = auVar73[6] + auVar88[6];
      bVar65 = auVar73[7] + auVar88[7];
      uVar46 = CONCAT17(bVar65,CONCAT16(cVar62,uVar45));
      cVar64 = auVar73[8] + auVar88[8];
      bVar67 = auVar73[9] + auVar88[9];
      auVar70._0_10_ = CONCAT19(bVar67,CONCAT18(cVar64,uVar46));
      auVar70[10] = auVar73[10] + auVar88[10];
      auVar70[0xb] = auVar73[0xb] + auVar88[0xb];
      auVar72[0xc] = auVar73[0xc] + auVar88[0xc];
      auVar72._0_12_ = auVar70;
      auVar72[0xd] = auVar73[0xd] + auVar88[0xd];
      auVar74[0xe] = auVar73[0xe] + auVar88[0xe];
      auVar74._0_14_ = auVar72;
      auVar74[0xf] = auVar73[0xf] + auVar88[0xf];
      auVar104[0] = (char)(uVar43 >> 4) + auVar73[0];
      auVar104[1] = (bVar59 >> 4) + bVar59;
      auVar104[2] = (char)(ushort)((uint)uVar44 >> 0x14) + cVar51;
      auVar104[3] = (bVar61 >> 4) + bVar61;
      auVar104[4] = (char)(ushort)((uint6)uVar45 >> 0x24) + cVar60;
      auVar104[5] = (bVar63 >> 4) + bVar63;
      auVar104[6] = (char)(ushort)((ulong)uVar46 >> 0x34) + cVar62;
      auVar104[7] = (bVar65 >> 4) + bVar65;
      auVar104[8] = (char)(ushort)((unkuint10)auVar70._0_10_ >> 0x44) + cVar64;
      auVar104[9] = (bVar67 >> 4) + bVar67;
      auVar104[10] = (char)(auVar70._10_2_ >> 4) + auVar70[10];
      auVar104[0xb] = (auVar70[0xb] >> 4) + auVar70[0xb];
      auVar104[0xc] = (char)(auVar72._12_2_ >> 4) + auVar72[0xc];
      auVar104[0xd] = (auVar72[0xd] >> 4) + auVar72[0xd];
      auVar104[0xe] = (char)(auVar74._14_2_ >> 4) + auVar74[0xe];
      auVar104[0xf] = (auVar74[0xf] >> 4) + auVar74[0xf];
      auVar105 = psadbw(auVar104 & auVar21,(undefined1  [16])0x0);
      auVar75._0_2_ = (ushort)uVar36 >> 1;
      auVar75._2_2_ = (ushort)(uVar36 >> 0x10) >> 1;
      auVar75._4_2_ = (ushort)(uVar36 >> 0x20) >> 1;
      auVar75._6_2_ = (ushort)(uVar36 >> 0x31);
      auVar75._8_2_ = (ushort)uVar27 >> 1;
      auVar75._10_2_ = (ushort)(uVar27 >> 0x10) >> 1;
      auVar75._12_2_ = (ushort)(uVar27 >> 0x20) >> 1;
      auVar75._14_2_ = (ushort)(uVar27 >> 0x31);
      auVar75 = auVar75 & auVar19;
      bVar59 = (char)(uVar36 >> 8) - auVar75[1];
      uVar9 = CONCAT12((char)(uVar36 >> 0x18) - auVar75[3],
                       CONCAT11((char)(uVar36 >> 0x10) - auVar75[2],bVar59));
      uVar10 = CONCAT14((char)(uVar36 >> 0x28) - auVar75[5],
                        CONCAT13((char)(uVar36 >> 0x20) - auVar75[4],uVar9));
      uVar11 = CONCAT16((char)(uVar36 >> 0x38) - auVar75[7],
                        CONCAT15((char)(uVar36 >> 0x30) - auVar75[6],uVar10));
      Var12 = CONCAT18((char)(uVar27 >> 8) - auVar75[9],CONCAT17(-auVar75[8],uVar11));
      auVar14[9] = (char)(uVar27 >> 0x10) - auVar75[10];
      auVar14._0_9_ = Var12;
      auVar14[10] = (char)(uVar27 >> 0x18) - auVar75[0xb];
      auVar16[0xb] = (char)(uVar27 >> 0x20) - auVar75[0xc];
      auVar16._0_11_ = auVar14;
      auVar16[0xc] = (char)(uVar27 >> 0x28) - auVar75[0xd];
      auVar18[0xd] = (char)(uVar27 >> 0x30) - auVar75[0xe];
      auVar18._0_13_ = auVar16;
      auVar18[0xe] = (char)(uVar27 >> 0x38) - auVar75[0xf];
      auVar108[0xf] = 0;
      auVar108._0_15_ = auVar18;
      auVar88 = auVar108 << 8 & auVar20;
      auVar49._0_2_ = (ushort)((ushort)bVar59 << 8) >> 2;
      auVar49._2_2_ = (ushort)((uint3)uVar9 >> 10);
      auVar49._4_2_ = (ushort)((uint5)uVar10 >> 0x1a);
      auVar49._6_2_ = (ushort)((uint7)uVar11 >> 0x2a);
      auVar49._8_2_ = (ushort)((unkuint9)Var12 >> 0x3a);
      auVar49._10_2_ = auVar14._9_2_ >> 2;
      auVar49._12_2_ = auVar16._11_2_ >> 2;
      auVar49._14_2_ = auVar18._13_2_ >> 2;
      auVar49 = auVar49 & auVar20;
      bVar59 = auVar49[1] + auVar88[1];
      uVar43 = CONCAT11(bVar59,auVar49[0]);
      cVar51 = auVar49[2] + auVar88[2];
      bVar61 = auVar49[3] + auVar88[3];
      uVar44 = CONCAT13(bVar61,CONCAT12(cVar51,uVar43));
      cVar60 = auVar49[4] + auVar88[4];
      bVar63 = auVar49[5] + auVar88[5];
      uVar45 = CONCAT15(bVar63,CONCAT14(cVar60,uVar44));
      cVar62 = auVar49[6] + auVar88[6];
      bVar65 = auVar49[7] + auVar88[7];
      uVar46 = CONCAT17(bVar65,CONCAT16(cVar62,uVar45));
      cVar64 = auVar49[8] + auVar88[8];
      bVar67 = auVar49[9] + auVar88[9];
      auVar47._0_10_ = CONCAT19(bVar67,CONCAT18(cVar64,uVar46));
      auVar47[10] = auVar49[10] + auVar88[10];
      auVar47[0xb] = auVar49[0xb] + auVar88[0xb];
      auVar48[0xc] = auVar49[0xc] + auVar88[0xc];
      auVar48._0_12_ = auVar47;
      auVar48[0xd] = auVar49[0xd] + auVar88[0xd];
      auVar50[0xe] = auVar49[0xe] + auVar88[0xe];
      auVar50._0_14_ = auVar48;
      auVar50[0xf] = auVar49[0xf] + auVar88[0xf];
      auVar76[0] = (char)(uVar43 >> 4) + auVar49[0];
      auVar76[1] = (bVar59 >> 4) + bVar59;
      auVar76[2] = (char)(ushort)((uint)uVar44 >> 0x14) + cVar51;
      auVar76[3] = (bVar61 >> 4) + bVar61;
      auVar76[4] = (char)(ushort)((uint6)uVar45 >> 0x24) + cVar60;
      auVar76[5] = (bVar63 >> 4) + bVar63;
      auVar76[6] = (char)(ushort)((ulong)uVar46 >> 0x34) + cVar62;
      auVar76[7] = (bVar65 >> 4) + bVar65;
      auVar76[8] = (char)(ushort)((unkuint10)auVar47._0_10_ >> 0x44) + cVar64;
      auVar76[9] = (bVar67 >> 4) + bVar67;
      auVar76[10] = (char)(auVar47._10_2_ >> 4) + auVar47[10];
      auVar76[0xb] = (auVar47[0xb] >> 4) + auVar47[0xb];
      auVar76[0xc] = (char)(auVar48._12_2_ >> 4) + auVar48[0xc];
      auVar76[0xd] = (auVar48[0xd] >> 4) + auVar48[0xd];
      auVar76[0xe] = (char)(auVar50._14_2_ >> 4) + auVar50[0xe];
      auVar76[0xf] = (auVar50[0xf] >> 4) + auVar50[0xf];
      auVar88 = psadbw(auVar76 & auVar21,(undefined1  [16])0x0);
      sVar5 = auVar88._0_2_;
      sVar6 = auVar88._2_2_;
      sVar7 = auVar88._4_2_;
      sVar8 = auVar88._6_2_;
      iVar68 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar88[6] - (0xff < sVar8),
                        CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar88[4] - (0xff < sVar7),
                                 CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar88[2] -
                                          (0xff < sVar6),
                                          (0 < sVar5) * (sVar5 < 0x100) * auVar88[0] -
                                          (0xff < sVar5))));
      sVar5 = auVar88._8_2_;
      sVar6 = auVar88._10_2_;
      sVar7 = auVar88._12_2_;
      sVar8 = auVar88._14_2_;
      auVar71._0_8_ =
           CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar88[0xe] - (0xff < sVar8),
                    CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar88[0xc] - (0xff < sVar7),
                             CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar88[10] - (0xff < sVar6),
                                      CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar88[8] -
                                               (0xff < sVar5),iVar68))));
      sVar5 = auVar105._0_2_;
      auVar71[8] = (0 < sVar5) * (sVar5 < 0x100) * auVar105[0] - (0xff < sVar5);
      sVar5 = auVar105._2_2_;
      auVar71[9] = (0 < sVar5) * (sVar5 < 0x100) * auVar105[2] - (0xff < sVar5);
      sVar5 = auVar105._4_2_;
      auVar71[10] = (0 < sVar5) * (sVar5 < 0x100) * auVar105[4] - (0xff < sVar5);
      sVar5 = auVar105._6_2_;
      auVar71[0xb] = (0 < sVar5) * (sVar5 < 0x100) * auVar105[6] - (0xff < sVar5);
      sVar5 = auVar105._8_2_;
      auVar77[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar105[8] - (0xff < sVar5);
      auVar77._0_12_ = auVar71;
      sVar5 = auVar105._10_2_;
      auVar77[0xd] = (0 < sVar5) * (sVar5 < 0x100) * auVar105[10] - (0xff < sVar5);
      sVar5 = auVar105._12_2_;
      auVar77[0xe] = (0 < sVar5) * (sVar5 < 0x100) * auVar105[0xc] - (0xff < sVar5);
      sVar5 = auVar105._14_2_;
      auVar77[0xf] = (0 < sVar5) * (sVar5 < 0x100) * auVar105[0xe] - (0xff < sVar5);
      uVar69 = iVar68 + iVar81;
      uVar78 = (int)((ulong)auVar71._0_8_ >> 0x20) + (int)((ulong)auVar84._0_8_ >> 0x20);
      uVar79 = auVar71._8_4_ + auVar84._8_4_;
      uVar80 = auVar77._12_4_ + auVar95._12_4_;
      uVar28 = uVar28 + uVar79;
      uVar29 = uVar29 + lVar52;
      iVar37 = iVar37 + uVar69;
      iVar38 = iVar38 + uVar78;
      iVar39 = iVar39 + uVar79;
      iVar40 = iVar40 + uVar80;
      uVar41 = uVar41 + uVar69;
      uVar42 = uVar42 + uVar78;
      uVar25 = uVar25 + lVar52;
      uVar24 = uVar24 + uVar80;
      uVar23 = uVar23 + 1;
      uVar32 = this->n_blocks - 1;
    } while (uVar23 < uVar32);
  }
  uVar23 = uVar32 >> 0x19;
  if ((uVar32 & 0x1ffffff) == 0) {
    ppVar3 = (this->superblock_ranks).super__Vector_base<p_rank_n,_std::allocator<p_rank_n>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar3[uVar23].A = uVar41;
    ppVar3[uVar23].C = uVar42;
    ppVar3[uVar23].G = uVar28;
    ppVar3[uVar23].N = uVar25;
    ppVar3[uVar23].T = uVar24;
    iVar37 = 0;
    iVar38 = 0;
    iVar39 = 0;
    iVar40 = 0;
    uVar29 = 0;
  }
  puVar2 = this->data;
  uVar32 = (ulong)(uint)((int)(uVar32 & 0x1ffffff) << 6);
  piVar1 = (int *)(puVar2 + uVar32 + 0x30 + uVar23 * 0x80000000);
  *piVar1 = iVar37;
  piVar1[1] = iVar38;
  piVar1[2] = iVar39;
  piVar1[3] = iVar40;
  *(ulong *)(puVar2 + uVar32 + uVar23 * 0x80000000) =
       *(long *)(puVar2 + uVar32 + uVar23 * 0x80000000) + (uVar29 & 0x7ff);
  *(ulong *)(puVar2 + uVar32 + 0x10 + uVar23 * 0x80000000) =
       *(long *)(puVar2 + uVar32 + 0x10 + uVar23 * 0x80000000) +
       (ulong)((uint)(uVar29 >> 0xb) & 0x7ff);
  *(ulong *)(puVar2 + uVar32 + 0x20 + uVar23 * 0x80000000) =
       *(long *)(puVar2 + uVar32 + 0x20 + uVar23 * 0x80000000) + (uVar29 >> 0x16 & 0x7ff);
  return;
}

Assistant:

void build_rank_support(){

		p_rank_n superblock_r = {};
		p_rank_n block_r = {};

		for(uint64_t bl = 0; bl < n_blocks-1; ++bl){

			uint64_t superblock_number = bl/BLOCKS_PER_SUPERBLOCK_N;
			uint64_t block_number = bl%BLOCKS_PER_SUPERBLOCK_N;

			if(block_number == 0){

				superblock_ranks[superblock_number]=superblock_r;
				block_r = {};

			}

			set_counters(superblock_number, block_number,block_r);

			p_rank_n local_rank = block_rank(superblock_number, block_number);

			block_r = block_r + local_rank;
			superblock_r = superblock_r + local_rank;

		}

		uint64_t superblock_number = (n_blocks-1)/BLOCKS_PER_SUPERBLOCK_N;
		uint64_t block_number = (n_blocks-1)%BLOCKS_PER_SUPERBLOCK_N;

		if(block_number == 0){

			superblock_ranks[superblock_number]=superblock_r;
			block_r = {};

		}

		set_counters(superblock_number, block_number,block_r);

	}